

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

BOOL __thiscall
Js::RecyclableTypedArrayWalker::Get
          (RecyclableTypedArrayWalker *this,int i,ResolvedObject *pResolvedObject)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  undefined4 extraout_var;
  LPCWSTR pWVar6;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar7;
  RecyclableTypedArrayAddress *this_00;
  uint32 local_9c;
  TrackAllocData local_80;
  StringBuilder<Memory::ArenaAllocator> *local_58;
  StringBuilder<Memory::ArenaAllocator> *builder;
  TypedArrayBase *pTStack_48;
  int nonArrayElementCount;
  TypedArrayBase *typedArrayObj;
  ResolvedObject *pResolvedObject_local;
  RecyclableTypedArrayWalker *pRStack_30;
  int i_local;
  RecyclableTypedArrayWalker *this_local;
  Var local_20;
  TypeId local_18;
  TypeId local_14;
  RecyclableObject *pRStack_10;
  TypeId typeId;
  
  typedArrayObj = (TypedArrayBase *)pResolvedObject;
  pResolvedObject_local._4_4_ = i;
  pRStack_30 = this;
  if (pResolvedObject == (ResolvedObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xcd2,"(pResolvedObject)",
                                "Bad usage of RecyclableTypedArrayWalker::Get");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = VarIs<Js::TypedArrayBase>
                    ((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.instance);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xcd4,"(Js::VarIs<Js::TypedArrayBase>(instance))",
                                "Js::VarIs<Js::TypedArrayBase>(instance)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pTStack_48 = VarTo<Js::TypedArrayBase>
                         ((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.instance)
  ;
  if (((this->super_RecyclableArrayWalker).fOnlyOwnProperties & 1U) == 0) {
    local_9c = RecyclableObjectWalker::GetChildrenCount((RecyclableObjectWalker *)this);
  }
  else {
    local_9c = 0;
  }
  builder._4_4_ = local_9c;
  if ((int)pResolvedObject_local._4_4_ < (int)local_9c) {
    this_local._4_4_ =
         RecyclableObjectWalker::Get
                   ((RecyclableObjectWalker *)this,pResolvedObject_local._4_4_,
                    (ResolvedObject *)typedArrayObj);
  }
  else {
    pResolvedObject_local._4_4_ = pResolvedObject_local._4_4_ - local_9c;
    (typedArrayObj->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
    super_RecyclableObject.type.ptr =
         (Type *)(this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.scriptContext;
    iVar3 = (*(pTStack_48->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pTStack_48,(ulong)pResolvedObject_local._4_4_);
    *(ulong *)&(typedArrayObj->super_ArrayBufferParent).super_ArrayObject.length =
         CONCAT44(extraout_var,iVar3);
    local_20 = *(Var *)&(typedArrayObj->super_ArrayBufferParent).super_ArrayObject.length;
    if (local_20 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    bVar2 = TaggedInt::Is(local_20);
    if (bVar2) {
      local_18 = TypeIds_FirstNumberType;
    }
    else {
      bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(local_20);
      if (bVar2) {
        local_18 = TypeIds_Number;
      }
      else {
        pRStack_10 = UnsafeVarTo<Js::RecyclableObject>(local_20);
        if (pRStack_10 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        local_14 = RecyclableObject::GetTypeId(pRStack_10);
        if (0x57 < (int)local_14) {
          BVar4 = RecyclableObject::IsExternal(pRStack_10);
          if (BVar4 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                        "GetTypeId aValue has invalid TypeId");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
        }
        local_18 = local_14;
      }
    }
    *(TypeId *)&typedArrayObj->buffer = local_18;
    local_58 = RecyclableArrayWalker::GetBuilder(&this->super_RecyclableArrayWalker);
    if (local_58 == (StringBuilder<Memory::ArenaAllocator> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0xce6,"(builder)","builder");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    StringBuilder<Memory::ArenaAllocator>::Reset(local_58);
    pWVar6 = RecyclableArrayWalker::GetIndexName
                       (&this->super_RecyclableArrayWalker,pResolvedObject_local._4_4_,local_58);
    *(LPCWSTR *)&typedArrayObj->BYTES_PER_ELEMENT = pWVar6;
    if (*(int *)&typedArrayObj->buffer == 0x17) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0xcea,"(pResolvedObject->typeId != TypeIds_HostDispatch)",
                                  "pResolvedObject->typeId != TypeIds_HostDispatch");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pAVar7 = &GetArenaFromContext((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.
                                  scriptContext)->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_80,(type_info *)&RecyclableTypedArrayAddress::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
               ,0xcef);
    pAVar7 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar7,&local_80);
    this_00 = (RecyclableTypedArrayAddress *)
              new<Memory::ArenaAllocator>(0x18,(ArenaAllocator *)pAVar7,0x3f67b0);
    RecyclableTypedArrayAddress::RecyclableTypedArrayAddress
              (this_00,(this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.instance,
               pResolvedObject_local._4_4_);
    (typedArrayObj->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.auxSlots.ptr =
         (WriteBarrierPtr<void> *)this_00;
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

BOOL RecyclableTypedArrayWalker::Get(int i, ResolvedObject* pResolvedObject)
    {
        AssertMsg(pResolvedObject, "Bad usage of RecyclableTypedArrayWalker::Get");

        Assert(Js::VarIs<Js::TypedArrayBase>(instance));

        Js::TypedArrayBase * typedArrayObj = Js::VarTo<Js::TypedArrayBase>(instance);

        int nonArrayElementCount = (!fOnlyOwnProperties ? RecyclableObjectWalker::GetChildrenCount() : 0);

        if (i < nonArrayElementCount)
        {
            return RecyclableObjectWalker::Get(i, pResolvedObject);
        }
        else
        {
            i -= nonArrayElementCount;
            pResolvedObject->scriptContext = scriptContext;
            pResolvedObject->obj = typedArrayObj->DirectGetItem(i);
            pResolvedObject->typeId = JavascriptOperators::GetTypeId(pResolvedObject->obj);

            StringBuilder<ArenaAllocator>* builder = GetBuilder();
            Assert(builder);
            builder->Reset();
            pResolvedObject->name = GetIndexName(i, builder);

            Assert(pResolvedObject->typeId != TypeIds_HostDispatch);

            pResolvedObject->address = Anew(GetArenaFromContext(scriptContext),
                RecyclableTypedArrayAddress,
                instance,
                i);
        }

        return TRUE;
    }